

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O2

Vec_Int_t * Ioa_WriteAigerLiterals(Aig_Man_t *pMan)

{
  Vec_Int_t *p;
  int *piVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = pMan->nObjs[3];
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar3 = iVar4;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar1;
  for (iVar4 = iVar4 - pMan->nRegs; iVar4 < pMan->vCos->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(pMan->vCos,iVar4);
    iVar3 = *(int *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28);
    Vec_IntPush(p,((uint)(iVar3 == 0) ^ (uint)*(ulong *)((long)pvVar2 + 8) & 1) + iVar3 * 2);
  }
  for (iVar4 = 0; iVar4 < pMan->nObjs[3] - pMan->nRegs; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(pMan->vCos,iVar4);
    iVar3 = *(int *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x28);
    Vec_IntPush(p,((uint)(iVar3 == 0) ^ (uint)*(ulong *)((long)pvVar2 + 8) & 1) + iVar3 * 2);
  }
  return p;
}

Assistant:

Vec_Int_t * Ioa_WriteAigerLiterals( Aig_Man_t * pMan )
{
    Vec_Int_t * vLits;
    Aig_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachLiSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}